

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

DECODER_MODEL_STATUS
av1_decoder_model_try_smooth_buf(AV1_COMP *cpi,size_t coded_bits,DECODER_MODEL *decoder_model)

{
  bool bVar1;
  int iVar2;
  DECODER_MODEL_STATUS DVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  DFG_INTERVAL *pDVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  
  if (decoder_model == (DECODER_MODEL *)0x0) {
    return '\0';
  }
  if ((decoder_model->status == '\0') && ((cpi->common).show_existing_frame == 0)) {
    lVar8 = coded_bits + decoder_model->coded_bits;
    iVar6 = decoder_model->decoder_buffer_delay;
    dVar9 = get_removal_time((uint)decoder_model->mode,decoder_model->num_decoded_frame + 1,iVar6,
                             decoder_model->frame_buffer_pool,decoder_model->current_time);
    DVar3 = '\x02';
    if (0.0 <= dVar9) {
      dVar12 = (double)(iVar6 + decoder_model->encoder_buffer_delay) / -90000.0 + dVar9;
      auVar11._8_4_ = (int)((ulong)lVar8 >> 0x20);
      auVar11._0_8_ = lVar8;
      auVar11._12_4_ = 0x45300000;
      dVar10 = decoder_model->last_bit_arrival_time;
      if (decoder_model->last_bit_arrival_time <= dVar12) {
        dVar10 = dVar12;
      }
      dVar12 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) /
               decoder_model->bit_rate + dVar10;
      if ((dVar12 <= dVar9) || (DVar3 = '\x05', decoder_model->is_low_delay_mode == true)) {
        iVar6 = (decoder_model->dfg_interval_queue).size;
        dVar9 = (decoder_model->dfg_interval_queue).total_interval;
        uVar5 = (ulong)(decoder_model->dfg_interval_queue).head;
        dVar13 = (decoder_model->dfg_interval_queue).buf[uVar5].removal_time;
        if (0 < iVar6 && dVar13 <= dVar12) {
          pDVar7 = (decoder_model->dfg_interval_queue).buf + uVar5;
          do {
            if (1.0 < (dVar13 - dVar10) + dVar9) {
              return '\x06';
            }
            dVar9 = dVar9 - (pDVar7->last_bit_arrival_time - pDVar7->first_bit_arrival_time);
            iVar2 = (int)uVar5;
            uVar4 = iVar2 + 0x40;
            if (-1 < (int)(iVar2 + 1U)) {
              uVar4 = iVar2 + 1U;
            }
            uVar4 = (iVar2 - (uVar4 & 0xffffffc0)) + 1;
            uVar5 = (ulong)uVar4;
            dVar13 = (decoder_model->dfg_interval_queue).buf[(int)uVar4].removal_time;
            if (dVar12 < dVar13) break;
            pDVar7 = (decoder_model->dfg_interval_queue).buf + (int)uVar4;
            bVar1 = 1 < iVar6;
            iVar6 = iVar6 + -1;
          } while (bVar1);
        }
        DVar3 = '\x06';
        if ((dVar12 - dVar10) + dVar9 <= 1.0) {
          DVar3 = '\0';
        }
      }
    }
  }
  else {
    DVar3 = '\0';
  }
  return DVar3;
}

Assistant:

DECODER_MODEL_STATUS av1_decoder_model_try_smooth_buf(
    const AV1_COMP *const cpi, size_t coded_bits,
    const DECODER_MODEL *const decoder_model) {
  DECODER_MODEL_STATUS status = DECODER_MODEL_OK;

  if (!decoder_model || decoder_model->status != DECODER_MODEL_OK) {
    return status;
  }

  const AV1_COMMON *const cm = &cpi->common;
  const int show_existing_frame = cm->show_existing_frame;

  size_t cur_coded_bits = decoder_model->coded_bits + coded_bits;
  int num_decoded_frame = decoder_model->num_decoded_frame;
  if (!show_existing_frame) ++num_decoded_frame;

  if (show_existing_frame) {
    return status;
  } else {
    const double removal_time = get_removal_time(
        decoder_model->mode, num_decoded_frame,
        decoder_model->decoder_buffer_delay, decoder_model->frame_buffer_pool,
        decoder_model->current_time);
    if (removal_time < 0.0) {
      status = DECODE_FRAME_BUF_UNAVAILABLE;
      return status;
    }

    // A frame with show_existing_frame being false indicates the end of a DFG.
    // Update the bits arrival time of this DFG.
    const double buffer_delay = (decoder_model->encoder_buffer_delay +
                                 decoder_model->decoder_buffer_delay) /
                                90000.0;
    const double latest_arrival_time = removal_time - buffer_delay;
    const double first_bit_arrival_time =
        AOMMAX(decoder_model->last_bit_arrival_time, latest_arrival_time);
    const double last_bit_arrival_time =
        first_bit_arrival_time +
        (double)cur_coded_bits / decoder_model->bit_rate;
    // Smoothing buffer underflows if the last bit arrives after the removal
    // time.
    if (last_bit_arrival_time > removal_time &&
        !decoder_model->is_low_delay_mode) {
      status = SMOOTHING_BUFFER_UNDERFLOW;
      return status;
    }

    // Check if the smoothing buffer overflows.
    const DFG_INTERVAL_QUEUE *const queue = &decoder_model->dfg_interval_queue;
    if (queue->size >= DFG_INTERVAL_QUEUE_SIZE) {
      assert(0);
    }

    double total_interval = queue->total_interval;
    int qhead = queue->head;
    int qsize = queue->size;
    // Remove the DFGs with removal time earlier than last_bit_arrival_time.
    while (queue->buf[qhead].removal_time <= last_bit_arrival_time &&
           qsize > 0) {
      if (queue->buf[qhead].removal_time - first_bit_arrival_time +
              total_interval >
          1.0) {
        status = SMOOTHING_BUFFER_OVERFLOW;
        return status;
      }
      total_interval -= queue->buf[qhead].last_bit_arrival_time -
                        queue->buf[qhead].first_bit_arrival_time;
      qhead = (qhead + 1) % DFG_INTERVAL_QUEUE_SIZE;
      --qsize;
    }
    total_interval += last_bit_arrival_time - first_bit_arrival_time;
    // The smoothing buffer can hold at most "bit_rate" bits, which is
    // equivalent to 1 second of total interval.
    if (total_interval > 1.0) {
      status = SMOOTHING_BUFFER_OVERFLOW;
      return status;
    }

    return status;
  }
}